

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_cfg.cpp
# Opt level: O3

void mpp_enc_cfg_show(void)

{
  MppTrieInfo *pMVar1;
  MppTrieInfo MVar2;
  MppEncCfgService *pMVar3;
  MppTrieInfo *info;
  char *pcVar4;
  uint uVar5;
  MppTrieInfo *node;
  
  pMVar3 = MppEncCfgService::get();
  if (pMVar3->mTrie == (MppTrie)0x0) {
    _mpp_log_l(4,"mpp_enc_cfg","dumping valid configure string start\n",(char *)0x0);
  }
  else {
    info = mpp_trie_get_info_first(pMVar3->mTrie);
    _mpp_log_l(4,"mpp_enc_cfg","dumping valid configure string start\n",(char *)0x0);
    for (; info != (MppTrieInfo *)0x0; info = mpp_trie_get_info_next(pMVar3->mTrie,info)) {
      MVar2 = *info;
      pMVar1 = info + 1;
      if (((uint)MVar2 & 0xfff000) == 0x14000) {
        uVar5 = (uint)MVar2 >> 0x18;
        pcVar4 = strof_cfg_type(*(CfgType *)(&pMVar1->field_0x0 + uVar5));
        _mpp_log_l(4,"mpp_enc_cfg","%-25s type %s - %d:%d\n",(char *)0x0,pMVar1,pcVar4,
                   (ulong)*(uint *)(&info[4].field_0x0 + uVar5),
                   (ulong)*(uint *)(&info[5].field_0x0 + uVar5));
      }
      else {
        _mpp_log_l(4,"mpp_enc_cfg","%-25s size - %d\n",(char *)0x0,pMVar1,
                   (ulong)((uint)MVar2 >> 0xc & 0xfff));
      }
      if (pMVar3->mTrie == (MppTrie)0x0) break;
    }
  }
  _mpp_log_l(4,"mpp_enc_cfg","dumping valid configure string done\n",(char *)0x0);
  _mpp_log_l(4,"mpp_enc_cfg","total cfg count %d with %d node size %d\n",(char *)0x0,
             (ulong)(uint)(pMVar3->mHead).info_count,(ulong)(uint)(pMVar3->mHead).node_count,
             (ulong)(uint)(pMVar3->mHead).info_size);
  return;
}

Assistant:

void mpp_enc_cfg_show(void)
{
    MppEncCfgService *srv = MppEncCfgService::get();
    MppTrieInfo *root = srv->get_info_first();

    mpp_log("dumping valid configure string start\n");

    if (root) {
        MppTrieInfo *node = root;

        do {
            if (node->ctx_len == sizeof(MppCfgInfo)) {
                MppCfgInfo *info = (MppCfgInfo *)mpp_trie_info_ctx(node);

                mpp_log("%-25s type %s - %d:%d\n", mpp_trie_info_name(node),
                        strof_cfg_type(info->data_type), info->data_offset, info->data_size);
            } else {
                mpp_log("%-25s size - %d\n", mpp_trie_info_name(node), node->ctx_len);
            }

            node = srv->get_info_next(node);
            if (!node)
                break;
        } while (1);
    }
    mpp_log("dumping valid configure string done\n");

    mpp_log("total cfg count %d with %d node size %d\n",
            srv->get_info_count(), srv->get_node_count(), srv->get_info_size());
}